

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_3::CreateContextExtCase::CreateContextExtCase
          (CreateContextExtCase *this,EglTestContext *eglTestCtx,EGLenum api,EGLint *attribList,
          FilterList *filter,char *name,char *description)

{
  FilterList *__first;
  ContextType CVar1;
  size_t sVar2;
  allocator<int> local_45 [13];
  char *local_38;
  char *name_local;
  FilterList *filter_local;
  EGLint *attribList_local;
  EglTestContext *pEStack_18;
  EGLenum api_local;
  EglTestContext *eglTestCtx_local;
  CreateContextExtCase *this_local;
  
  local_38 = name;
  name_local = (char *)filter;
  filter_local = (FilterList *)attribList;
  attribList_local._4_4_ = api;
  pEStack_18 = eglTestCtx;
  eglTestCtx_local = (EglTestContext *)this;
  TestCase::TestCase(&this->super_TestCase,eglTestCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CreateContextExtCase_006726c0;
  this->m_isOk = true;
  this->m_iteration = 0;
  eglu::FilterList::FilterList(&this->m_filter,(FilterList *)name_local);
  __first = filter_local;
  sVar2 = getAttribListLength((EGLint *)filter_local);
  std::allocator<int>::allocator(local_45);
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&this->m_attribList,(int *)__first,
             (int *)((long)&(__first->m_rules).
                            super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                            ._M_impl.super__Vector_impl_data._M_start + sVar2 * 4),local_45);
  std::allocator<int>::~allocator(local_45);
  this->m_api = attribList_local._4_4_;
  this->m_display = (EGLDisplay)0x0;
  std::vector<void_*,_std::allocator<void_*>_>::vector(&this->m_configs);
  CVar1 = attribListToContextType(attribList_local._4_4_,(EGLint *)filter_local);
  (this->m_glContextType).super_ApiType.m_bits = (deUint32)CVar1.super_ApiType.m_bits;
  return;
}

Assistant:

CreateContextExtCase::CreateContextExtCase (EglTestContext& eglTestCtx, EGLenum api, const EGLint* attribList, const eglu::FilterList& filter, const char* name, const char* description)
	: TestCase			(eglTestCtx, name, description)
	, m_isOk			(true)
	, m_iteration		(0)
	, m_filter			(filter)
	, m_attribList		(attribList, attribList + getAttribListLength(attribList))
	, m_api				(api)
	, m_display			(EGL_NO_DISPLAY)
	, m_glContextType	(attribListToContextType(api, attribList))
{
}